

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pending_with_parameters.cpp
# Opt level: O0

void CheckSimpleQueryAfterModification(Connection *con)

{
  initializer_list<duckdb::Value> iVar1;
  initializer_list<duckdb::Value> iVar2;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  vector *in_RDI;
  Value *this;
  AssertionHandler catchAssertionHandler_1;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> result;
  AssertionHandler catchAssertionHandler;
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
  pending_result;
  vector<duckdb::Value,_true> values;
  undefined4 in_stack_fffffffffffffcf8;
  Flags in_stack_fffffffffffffcfc;
  AssertionHandler *in_stack_fffffffffffffd00;
  StringRef *in_stack_fffffffffffffd08;
  AssertionHandler *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  size_type in_stack_fffffffffffffd20;
  ExprLhs<bool> *in_stack_fffffffffffffd28;
  Value *pVVar3;
  AssertionHandler *in_stack_fffffffffffffd30;
  vector<duckdb::Value,_true> *in_stack_fffffffffffffd60;
  size_t in_stack_fffffffffffffd68;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
  *in_stack_fffffffffffffd70;
  Value *local_248;
  Value local_228 [64];
  Value *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1b9;
  SourceLineInfo local_1a8;
  StringRef local_198;
  undefined1 local_131;
  SourceLineInfo local_120;
  StringRef local_110;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [24];
  Value *local_78;
  Value local_70 [64];
  Value *local_30;
  undefined8 local_28;
  vector *local_8;
  
  local_78 = local_70;
  local_8 = in_RDI;
  duckdb::Value::Value(local_78,0xe);
  local_30 = local_70;
  local_28 = 1;
  std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x630d3c);
  iVar1._M_len = (size_type)in_stack_fffffffffffffd10;
  iVar1._M_array = (iterator)in_stack_fffffffffffffd08;
  duckdb::vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffd00,iVar1,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x630d70);
  local_248 = (Value *)&local_30;
  do {
    local_248 = local_248 + -0x40;
    duckdb::Value::~Value(local_248);
  } while (local_248 != local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"SELECT COUNT(*) FROM a WHERE i=?",&local_b1);
  duckdb::Connection::PendingQuery(local_90,local_8,SUB81(local_b0,0));
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_110 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffd00,
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
             ,0x33);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  capturedExpression.m_size = in_stack_fffffffffffffd20;
  capturedExpression.m_start = in_stack_fffffffffffffd18;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
             (SourceLineInfo *)in_stack_fffffffffffffd00,capturedExpression,
             in_stack_fffffffffffffcfc);
  duckdb::
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>::
  operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              *)in_stack_fffffffffffffd00);
  duckdb::BaseQueryResult::HasError();
  local_131 = Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                         ,false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffd00);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffd00);
  duckdb::
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>::
  operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              *)in_stack_fffffffffffffd00);
  duckdb::PendingQueryResult::Execute();
  local_198 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffd00,
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
             ,0x35);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  capturedExpression_00.m_size = in_stack_fffffffffffffd20;
  capturedExpression_00.m_start = in_stack_fffffffffffffd18;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
             (SourceLineInfo *)in_stack_fffffffffffffd00,capturedExpression_00,
             in_stack_fffffffffffffcfc);
  duckdb::Value::Value(local_228,1);
  local_1e8 = local_228;
  local_1e0 = 1;
  std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x6311ce);
  iVar2._M_len = (size_type)in_stack_fffffffffffffd10;
  iVar2._M_array = (iterator)in_stack_fffffffffffffd08;
  duckdb::vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffd00,iVar2,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  duckdb::CHECK_COLUMN
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  local_1b9 = Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                         ,false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  duckdb::vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x63125d);
  std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x63126a);
  pVVar3 = local_228;
  this = (Value *)&local_1e8;
  do {
    this = this + -0x40;
    duckdb::Value::~Value(this);
  } while (this != pVVar3);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffd00);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffd00);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x631438);
  duckdb::
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
               *)0x631445);
  duckdb::vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x631452);
  return;
}

Assistant:

static void CheckSimpleQueryAfterModification(Connection &con) {
	duckdb::vector<Value> values = {Value(14)};
	auto pending_result = con.PendingQuery("SELECT COUNT(*) FROM a WHERE i=?", values, true);
	REQUIRE(!pending_result->HasError());
	auto result = pending_result->Execute();
	REQUIRE(CHECK_COLUMN(result, 0, {1}));
}